

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20240722::debugging_internal::Demangle(char *mangled,char *out,size_t out_size)

{
  char *str;
  long lVar1;
  undefined1 uVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  State state;
  State local_30;
  
  if ((*mangled == '_') && (mangled[1] == 'R')) {
    uVar2 = absl::lts_20240722::debugging_internal::DemangleRustSymbolEncoding(mangled,out,out_size)
    ;
    return (bool)uVar2;
  }
  local_30.out_end_idx = (int)out_size;
  local_30.parse_state.mangled_idx = 0;
  local_30.parse_state.out_cur_idx = 0;
  local_30.parse_state.prev_name_idx = 0;
  local_30.parse_state._12_4_ = 0xffff0000;
  local_30.recursion_depth = 1;
  local_30.steps = 1;
  local_30.mangled_begin = mangled;
  local_30.out = out;
  bVar3 = ParseMangledName(&local_30);
  if (bVar3) {
    lVar4 = (long)local_30.parse_state.mangled_idx;
    if (local_30.mangled_begin[lVar4] != '\0') {
      str = local_30.mangled_begin + lVar4;
      lVar5 = 0;
      do {
        if (str[lVar5] == '.') {
          if ((str[lVar5 + 1] != 0x5f) && (0x19 < (byte)((str[lVar5 + 1] & 0xdfU) + 0xbf)))
          goto LAB_00102213;
          lVar5 = lVar5 + 1;
          do {
            do {
              lVar1 = lVar5 + lVar4 + 1;
              lVar5 = lVar5 + 1;
            } while (local_30.mangled_begin[lVar1] == 0x5f);
          } while ((byte)((local_30.mangled_begin[lVar1] & 0xdfU) + 0xbf) < 0x1a);
          bVar3 = true;
        }
        else {
          if (str[lVar5] == '\0') goto LAB_00102279;
LAB_00102213:
          bVar3 = false;
        }
        if ((str[lVar5] == '.') && ((byte)(str[lVar5 + 1] - 0x30U) < 10)) {
          lVar5 = lVar5 + 1;
          do {
            lVar1 = lVar5 + lVar4 + 1;
            lVar5 = lVar5 + 1;
          } while ((byte)(local_30.mangled_begin[lVar1] - 0x30U) < 10);
          bVar3 = true;
        }
      } while (bVar3);
      if (local_30.mangled_begin[lVar4] != '@') goto LAB_00102291;
      MaybeAppend(&local_30,str);
    }
LAB_00102279:
    bVar3 = 0 < local_30.parse_state.out_cur_idx &&
            local_30.parse_state.out_cur_idx < local_30.out_end_idx;
  }
  else {
LAB_00102291:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Demangle(const char* mangled, char* out, size_t out_size) {
  if (mangled[0] == '_' && mangled[1] == 'R') {
    return DemangleRustSymbolEncoding(mangled, out, out_size);
  }

  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !Overflowed(&state) &&
         state.parse_state.out_cur_idx > 0;
}